

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int read_chunk_bytes(spng_ctx *ctx,uint32_t bytes)

{
  uint32_t uVar1;
  int ret;
  uint32_t bytes_local;
  spng_ctx *ctx_local;
  
  if (ctx == (spng_ctx *)0x0) {
    ctx_local._4_4_ = 0x50;
  }
  else if ((ctx->cur_chunk_bytes_left == 0) || (bytes == 0)) {
    ctx_local._4_4_ = 0x50;
  }
  else if (ctx->cur_chunk_bytes_left < bytes) {
    ctx_local._4_4_ = 0x50;
  }
  else {
    ctx_local._4_4_ = read_data(ctx,(ulong)bytes);
    if (ctx_local._4_4_ == 0) {
      if ((*(ushort *)&ctx->field_0xcc >> 7 & 1) == 0) {
        uVar1 = crc32(ctx->cur_actual_crc,ctx->data,bytes);
        ctx->cur_actual_crc = uVar1;
      }
      ctx->cur_chunk_bytes_left = ctx->cur_chunk_bytes_left - bytes;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int read_chunk_bytes(spng_ctx *ctx, uint32_t bytes)
{
    if(ctx == NULL) return SPNG_EINTERNAL;
    if(!ctx->cur_chunk_bytes_left || !bytes) return SPNG_EINTERNAL;
    if(bytes > ctx->cur_chunk_bytes_left) return SPNG_EINTERNAL; /* XXX: more specific error? */

    int ret;

    ret = read_data(ctx, bytes);
    if(ret) return ret;

    if(!ctx->skip_crc) ctx->cur_actual_crc = crc32(ctx->cur_actual_crc, ctx->data, bytes);

    ctx->cur_chunk_bytes_left -= bytes;

    return ret;
}